

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O3

void bench_ellswift_create(void *arg,int iters)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  undefined8 *puVar10;
  long lVar11;
  char **argv;
  int argc;
  undefined8 *puVar12;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  undefined8 *puVar18;
  uchar buf [64];
  int in_stack_fffffffffffffdb8;
  char **ppcStack_240;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined1 auStack_1e0 [72];
  undefined8 uStack_198;
  undefined1 auStack_190 [40];
  undefined8 uStack_168;
  undefined1 auStack_160 [64];
  undefined1 auStack_120 [64];
  undefined8 uStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  undefined8 *puStack_c8;
  undefined8 *puStack_c0;
  code *pcStack_b8;
  int iStack_ac;
  undefined8 *puStack_a8;
  undefined8 uStack_a0;
  ulong uStack_98;
  long lStack_90;
  undefined1 *puStack_88;
  void *pvStack_80;
  undefined8 *puStack_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 uVar13;
  
  if (iters < 1) {
    return;
  }
  uVar7 = (ulong)(uint)iters;
  puVar1 = (undefined8 *)((long)arg + 0x4008);
  while( true ) {
    puVar12 = *arg;
    iStack_ac = (int)&local_68;
    iVar3 = secp256k1_ellswift_create(puVar12,&local_68,puVar1,(long)arg + 0x4028);
    if (iVar3 == 0) break;
    *(undefined8 *)((long)arg + 0x4038) = local_38;
    *(undefined8 *)((long)arg + 0x4040) = uStack_30;
    *(undefined8 *)((long)arg + 0x4028) = local_48;
    *(undefined8 *)((long)arg + 0x4030) = uStack_40;
    *(undefined8 *)((long)arg + 0x4018) = local_58;
    *(undefined8 *)((long)arg + 0x4020) = uStack_50;
    *puVar1 = local_68;
    *(undefined8 *)((long)arg + 0x4010) = uStack_60;
    uVar9 = (int)uVar7 - 1;
    uVar7 = (ulong)uVar9;
    if (uVar9 == 0) {
      return;
    }
  }
  bench_ellswift_create_cold_1();
  if (iStack_ac < 1) {
    return;
  }
  puVar2 = puVar12 + 0x801;
  uStack_a0 = _secp256k1_ellswift_xdh_hash_function_bip324;
  puVar10 = puVar12 + 0x803;
  uVar15 = 0x10;
  uVar16 = 0;
  puVar18 = puVar2;
  puStack_a8 = puVar12;
  uStack_98 = uVar7;
  lStack_90 = (long)arg + 0x4028;
  puStack_88 = (undefined1 *)&local_68;
  pvStack_80 = arg;
  puStack_78 = puVar1;
  while( true ) {
    argv = (char **)((long)puVar18 + (uVar16 / 0x21) * -0x21);
    uVar13 = *puStack_a8;
    pcStack_b8 = (code *)0x0;
    puStack_c0 = (undefined8 *)uStack_a0;
    puStack_c8 = (undefined8 *)0x102f80;
    iVar3 = secp256k1_ellswift_xdh
                      (uVar13,argv,puVar2,puVar2,(long)puVar10 + (uVar15 / 0x21) * -0x21);
    argc = (int)uVar13;
    if (iVar3 != 1) break;
    uVar16 = uVar16 + 1;
    puVar10 = (undefined8 *)((long)puVar10 + 1);
    uVar15 = uVar15 + 1;
    puVar18 = (undefined8 *)((long)puVar18 + 1);
    if (iStack_ac == (int)uVar16) {
      return;
    }
  }
  pcStack_b8 = main;
  bench_ellswift_xdh_cold_1();
  uStack_e0 = 0xf83e0f83e0f83e1;
  uStack_d8 = uVar15;
  uStack_d0 = uVar16;
  puStack_c8 = puVar2;
  puStack_c0 = puVar18;
  pcStack_b8 = (code *)puVar10;
  pcVar6 = getenv("SECP256K1_BENCH_ITERS");
  if (pcVar6 == (char *)0x0) {
    uVar7 = 20000;
  }
  else {
    uVar7 = strtol(pcVar6,(char **)0x0,0);
  }
  lVar17 = (long)argc;
  if (argc != 1) {
    ppcStack_240 = argv + 1;
    do {
      pcVar6 = *ppcStack_240;
      lVar11 = 0;
      while( true ) {
        pcVar14 = pcVar6;
        iVar3 = strcmp(pcVar6,*(char **)((long)&PTR_anon_var_dwarf_d5_00108d20 + lVar11));
        iVar5 = (int)pcVar14;
        if (iVar3 == 0) break;
        lVar11 = lVar11 + 8;
        if (lVar11 == 0xa8) goto LAB_0010305e;
      }
      ppcStack_240 = ppcStack_240 + 1;
    } while (ppcStack_240 != argv + lVar17);
LAB_0010305e:
    if (1 < argc) {
      lVar11 = lVar17 * 8;
      lVar8 = 8;
      do {
        pcVar6 = *(char **)((long)argv + lVar8);
        if (((*pcVar6 == '-') && (pcVar6[1] == 'h')) && (pcVar6[2] == '\0')) goto LAB_001030e7;
        lVar8 = lVar8 + 8;
      } while (lVar11 - lVar8 != 0);
      lVar8 = 8;
      do {
        if (lVar11 - lVar8 == 0) {
          lVar8 = 8;
          goto LAB_001030ce;
        }
        pcVar6 = *(char **)((long)argv + lVar8);
        iVar4 = strcmp(pcVar6,"--help");
        iVar5 = (int)pcVar6;
        lVar8 = lVar8 + 8;
      } while (iVar4 != 0);
      goto LAB_001030e7;
    }
  }
LAB_00103103:
  lVar17 = lVar17 * 8;
  lVar11 = 8;
  do {
    if (lVar17 == lVar11) {
      lVar11 = 8;
      goto LAB_0010313c;
    }
    iVar3 = strcmp(*(char **)((long)argv + lVar11),"recover");
    lVar11 = lVar11 + 8;
  } while (iVar3 != 0);
  goto LAB_00103155;
  while( true ) {
    iVar5 = strcmp(*(char **)((long)argv + lVar11),"ecdsa");
    lVar11 = lVar11 + 8;
    if (iVar5 == 0) break;
LAB_00103297:
    if (lVar17 == lVar11) {
      lVar11 = 8;
      goto LAB_001032bf;
    }
  }
  goto LAB_00103300;
  while( true ) {
    iVar5 = strcmp(*(char **)((long)argv + lVar11),"verify");
    lVar11 = lVar11 + 8;
    if (iVar5 == 0) break;
LAB_001032bf:
    if (lVar17 == lVar11) {
      lVar11 = 8;
      goto LAB_001032e7;
    }
  }
  goto LAB_00103300;
  while( true ) {
    iVar5 = strcmp(*(char **)((long)argv + lVar11),"sign");
    lVar11 = lVar11 + 8;
    if (iVar5 == 0) break;
LAB_00103357:
    if (lVar17 == lVar11) {
      lVar11 = 8;
      goto LAB_0010337f;
    }
  }
  goto LAB_00103398;
  while( true ) {
    iVar5 = strcmp(*(char **)((long)argv + lVar11),"ecdsa_sign");
    lVar11 = lVar11 + 8;
    if (iVar5 == 0) break;
LAB_0010337f:
    if (lVar17 == lVar11) goto LAB_001033ba;
  }
  goto LAB_00103398;
  while( true ) {
    iVar4 = strcmp(*(char **)((long)argv + lVar11),"ec_keygen");
    iVar5 = (int)uVar13;
    lVar11 = lVar11 + 8;
    if (iVar4 == 0) break;
LAB_00103417:
    if (lVar17 == lVar11) goto LAB_00103458;
  }
  goto LAB_00103430;
  while( true ) {
    pcVar6 = *(char **)((long)argv + lVar8);
    iVar4 = strcmp(pcVar6,"help");
    iVar5 = (int)pcVar6;
    lVar8 = lVar8 + 8;
    if (iVar4 == 0) break;
LAB_001030ce:
    if (lVar11 - lVar8 == 0) {
      if (iVar3 != 0) {
        main_cold_1();
        return;
      }
      goto LAB_00103103;
    }
  }
LAB_001030e7:
  help(iVar5);
  return;
  while( true ) {
    iVar3 = strcmp(*(char **)((long)argv + lVar11),"ecdsa_recover");
    lVar11 = lVar11 + 8;
    if (iVar3 == 0) break;
LAB_0010313c:
    if (lVar17 == lVar11) {
      uStack_228 = secp256k1_context_create(1);
      uStack_220 = 0x807060504030201;
      uStack_218 = 0x100f0e0d0c0b0a09;
      uStack_210 = 0x1817161514131211;
      uStack_208 = 0x201f1e1d1c1b1a19;
      uStack_200 = 0x2827262524232221;
      uStack_1f8 = 0x302f2e2d2c2b2a29;
      uStack_1f0 = 0x34333231;
      uStack_1ec = 0x38373635;
      uStack_1e8 = 0x3c3b3a39;
      uStack_1e4 = 0x403f3e3d;
      uStack_198 = 0x48;
      uVar13 = 0;
      iVar3 = secp256k1_ecdsa_sign(uStack_228,auStack_160,&uStack_220,&uStack_200,0);
      if (iVar3 == 0) {
        main_cold_6();
LAB_001034ae:
        main_cold_5();
      }
      else {
        iVar3 = secp256k1_ecdsa_signature_serialize_der
                          (uStack_228,auStack_1e0,&uStack_198,auStack_160);
        if (iVar3 == 0) goto LAB_001034ae;
        iVar3 = secp256k1_ec_pubkey_create(uStack_228,auStack_120,&uStack_200);
        if (iVar3 != 0) {
          uStack_168 = 0x21;
          iVar3 = secp256k1_ec_pubkey_serialize
                            (uStack_228,auStack_190,&uStack_168,auStack_120,0x102);
          if (iVar3 != 1) goto LAB_001034b8;
          printf("%-30s,%-15s,%-15s,%-15s\n","Benchmark","    Min(us)    ","    Avg(us)    ",
                 "    Max(us)    ");
          putchar(10);
          iVar3 = (int)uVar7;
          if (argc == 1) goto LAB_00103300;
          lVar11 = 8;
          goto LAB_00103297;
        }
      }
      main_cold_4();
LAB_001034b8:
      main_cold_3();
      puts("Benchmarks the following algorithms:");
      puts("    - ECDSA signing/verification");
      puts("    - ECDH key exchange (optional module)");
      puts("    - Schnorr signatures (optional module)");
      puts("    - ElligatorSwift (optional module)");
      putchar(10);
      printf("The default number of iterations for each benchmark is %d. This can be\n",20000);
      puts("customized using the SECP256K1_BENCH_ITERS environment variable.");
      putchar(10);
      puts("Usage: ./bench [args]");
      puts("By default, all benchmarks will be run.");
      puts("args:");
      puts("    help              : display this help and exit");
      puts("    ecdsa             : all ECDSA algorithms--sign, verify, recovery (if enabled)");
      puts("    ecdsa_sign        : ECDSA siging algorithm");
      puts("    ecdsa_verify      : ECDSA verification algorithm");
      puts("    ec                : all EC public key algorithms (keygen)");
      puts("    ec_keygen         : EC public key generation");
      puts("    ecdh              : ECDH key exchange algorithm");
      puts("    schnorrsig        : all Schnorr signature algorithms (sign, verify)");
      puts("    schnorrsig_sign   : Schnorr sigining algorithm");
      puts("    schnorrsig_verify : Schnorr verification algorithm");
      puts("    ellswift          : all ElligatorSwift benchmarks (encode, decode, keygen, ecdh)");
      puts("    ellswift_encode   : ElligatorSwift encoding");
      puts("    ellswift_decode   : ElligatorSwift decoding");
      puts("    ellswift_keygen   : ElligatorSwift key generation");
      puts("    ellswift_ecdh     : ECDH on ElligatorSwift keys");
      putchar(10);
      return;
    }
  }
LAB_00103155:
  main_cold_2();
  return;
  while( true ) {
    iVar5 = strcmp(*(char **)((long)argv + lVar11),"ecdsa_verify");
    lVar11 = lVar11 + 8;
    if (iVar5 == 0) break;
LAB_001032e7:
    if (lVar17 == lVar11) goto LAB_0010331d;
  }
LAB_00103300:
  run_benchmark("ecdsa_verify",bench_verify,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)&uStack_228,(void *)(uVar7 & 0xffffffff),(int)uVar13,
                in_stack_fffffffffffffdb8);
LAB_0010331d:
  if (argc != 1) {
    lVar11 = 8;
    do {
      if (lVar17 == lVar11) {
        lVar11 = 8;
        goto LAB_00103357;
      }
      iVar5 = strcmp(*(char **)((long)argv + lVar11),"ecdsa");
      lVar11 = lVar11 + 8;
    } while (iVar5 != 0);
  }
LAB_00103398:
  run_benchmark("ecdsa_sign",bench_sign_run,bench_sign_setup,(_func_void_void_ptr_int *)&uStack_228,
                (void *)(uVar7 & 0xffffffff),(int)uVar13,in_stack_fffffffffffffdb8);
LAB_001033ba:
  iVar5 = (int)uVar13;
  if (argc != 1) {
    lVar11 = 8;
    do {
      pcVar6 = *(char **)((long)argv + lVar11);
      if (((*pcVar6 == 'e') && (pcVar6[1] == 'c')) && (pcVar6[2] == '\0')) goto LAB_00103430;
      lVar11 = lVar11 + 8;
    } while (lVar17 != lVar11);
    lVar11 = 8;
    do {
      if (lVar17 == lVar11) {
        lVar11 = 8;
        goto LAB_00103417;
      }
      iVar4 = strcmp(*(char **)((long)argv + lVar11),"keygen");
      iVar5 = (int)uVar13;
      lVar11 = lVar11 + 8;
    } while (iVar4 != 0);
  }
LAB_00103430:
  run_benchmark("ec_keygen",bench_keygen_run,bench_keygen_setup,
                (_func_void_void_ptr_int *)&uStack_228,(void *)(uVar7 & 0xffffffff),iVar5,
                in_stack_fffffffffffffdb8);
LAB_00103458:
  secp256k1_context_destroy(uStack_228);
  run_ecdh_bench(iVar3,argc,argv);
  run_schnorrsig_bench(iVar3,argc,argv);
  run_ellswift_bench(iVar3,argc,argv);
  return;
}

Assistant:

static void bench_ellswift_create(void *arg, int iters) {
    int i;
    bench_ellswift_data *data = (bench_ellswift_data*)arg;

    for (i = 0; i < iters; i++) {
        unsigned char buf[64];
        CHECK(secp256k1_ellswift_create(data->ctx, buf, data->rnd64, data->rnd64 + 32));
        memcpy(data->rnd64, buf, 64);
    }
}